

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

CopyResult cmSystemTools::CopySingleFile(string *oldname,string *newname,CopyWhen when,string *err)

{
  bool bVar1;
  string local_a0;
  Status local_80;
  string local_78;
  Status local_54;
  Status local_4c;
  Status local_44;
  Status status;
  Status perms;
  mode_t perm;
  string *err_local;
  CopyWhen when_local;
  string *newname_local;
  string *oldname_local;
  
  unique0x100001e4 = err;
  if (((when == Always) || (when != OnlyIfDifferent)) ||
     (bVar1 = cmsys::SystemTools::FilesDiffer(oldname,newname), bVar1)) {
    perms.Kind_ = Success;
    status = cmsys::SystemTools::GetPermissions(oldname,&perms.Kind_);
    bVar1 = cmsys::SystemTools::SameFile(oldname,newname);
    if (bVar1) {
      oldname_local._4_4_ = Success;
    }
    else {
      cmsys::Status::Status(&local_44);
      local_4c = cmsys::SystemTools::CloneFileContent(oldname,newname);
      local_44 = local_4c;
      bVar1 = cmsys::Status::operator_cast_to_bool(&local_44);
      if (!bVar1) {
        local_54 = cmsys::SystemTools::CopyFileContentBlockwise(oldname,newname);
        local_44 = local_54;
      }
      bVar1 = cmsys::Status::operator_cast_to_bool(&local_44);
      if (bVar1) {
        bVar1 = cmsys::Status::operator_cast_to_bool(&status);
        if (bVar1) {
          local_80 = cmsys::SystemTools::SetPermissions(newname,perms.Kind_,false);
          local_44 = local_80;
          bVar1 = cmsys::Status::operator_cast_to_bool(&local_44);
          if (!bVar1) {
            if (stack0xffffffffffffffd0 != (string *)0x0) {
              cmsys::Status::GetString_abi_cxx11_(&local_a0,&local_44);
              std::__cxx11::string::operator=((string *)stack0xffffffffffffffd0,(string *)&local_a0)
              ;
              std::__cxx11::string::~string((string *)&local_a0);
            }
            return Failure;
          }
        }
        oldname_local._4_4_ = Success;
      }
      else {
        if (stack0xffffffffffffffd0 != (string *)0x0) {
          cmsys::Status::GetString_abi_cxx11_(&local_78,&local_44);
          std::__cxx11::string::operator=((string *)stack0xffffffffffffffd0,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
        oldname_local._4_4_ = Failure;
      }
    }
  }
  else {
    oldname_local._4_4_ = Success;
  }
  return oldname_local._4_4_;
}

Assistant:

cmSystemTools::CopyResult cmSystemTools::CopySingleFile(
  std::string const& oldname, std::string const& newname, CopyWhen when,
  std::string* err)
{
  switch (when) {
    case CopyWhen::Always:
      break;
    case CopyWhen::OnlyIfDifferent:
      if (!FilesDiffer(oldname, newname)) {
        return CopyResult::Success;
      }
      break;
  }

  mode_t perm = 0;
  cmsys::Status perms = SystemTools::GetPermissions(oldname, perm);

  // If files are the same do not copy
  if (SystemTools::SameFile(oldname, newname)) {
    return CopyResult::Success;
  }

  cmsys::Status status;
  status = cmsys::SystemTools::CloneFileContent(oldname, newname);
  if (!status) {
    // if cloning did not succeed, fall back to blockwise copy
    status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
  }
  if (!status) {
    if (err) {
      *err = status.GetString();
    }
    return CopyResult::Failure;
  }
  if (perms) {
    status = SystemTools::SetPermissions(newname, perm);
    if (!status) {
      if (err) {
        *err = status.GetString();
      }
      return CopyResult::Failure;
    }
  }
  return CopyResult::Success;
}